

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# _all.c
# Opt level: O1

int main(int argc,char **argv)

{
  byte bVar1;
  char *__s2;
  bool bVar2;
  int iVar3;
  byte bVar4;
  uchar uVar5;
  int iVar6;
  
  GREATEST_INIT();
  if (1 < argc) {
    iVar6 = 1;
    bVar4 = greatest_info.flags;
    uVar5 = greatest_info.verbosity;
    do {
      __s2 = argv[iVar6];
      if (*__s2 == '-') {
        bVar1 = __s2[1];
        if (bVar1 < 0x73) {
          if (bVar1 < 0x66) {
            if (bVar1 == 0x2d) {
LAB_00124f93:
              iVar3 = strncmp("--help",__s2,6);
              if (iVar3 == 0) goto LAB_0012537d;
              iVar3 = strncmp("--",__s2,2);
              if (iVar3 != 0) goto switchD_00124fe2_caseD_2;
              bVar2 = false;
              goto LAB_00125016;
            }
            if (bVar1 != 0x61) goto switchD_00124fe2_caseD_2;
LAB_00124f8d:
            bVar4 = bVar4 | 4;
            greatest_info.flags = bVar4;
          }
          else if (bVar1 == 0x66) {
LAB_00124f76:
            bVar4 = bVar4 | 1;
            greatest_info.flags = bVar4;
          }
          else {
switchD_00124fe2_default:
            if (bVar1 != 0x6c) {
              if (bVar1 == 0x68) {
LAB_0012537d:
                greatest_usage(*argv);
                exit(0);
              }
              goto switchD_00124fe2_caseD_2;
            }
            bVar4 = bVar4 | 2;
            greatest_info.flags = bVar4;
          }
LAB_00125014:
          bVar2 = true;
        }
        else {
          if (1 < bVar1 - 0x73) {
            if (bVar1 != 0x76) {
              if (bVar1 != 0x78) goto switchD_00124fe2_caseD_2;
              goto LAB_00124f52;
            }
switchD_00124fe2_caseD_3:
            uVar5 = uVar5 + '\x01';
            greatest_info.verbosity = uVar5;
            goto LAB_00125014;
          }
LAB_00124f52:
          iVar3 = iVar6 + 1;
          if (argc <= iVar3) goto LAB_001253a7;
          if (bVar1 < 0x68) {
            if (bVar1 == 0x2d) goto LAB_00124f93;
            if (bVar1 == 0x61) goto LAB_00124f8d;
            if (bVar1 == 0x66) goto LAB_00124f76;
switchD_00124fe2_caseD_2:
            fprintf(_stdout,"Unknown argument \'%s\'\n",__s2);
LAB_001253a7:
            greatest_usage(*argv);
            exit(1);
          }
          switch(bVar1 - 0x73) {
          case 0:
            greatest_info.suite_filter = argv[iVar3];
            break;
          case 1:
            greatest_info.test_filter = argv[iVar3];
            break;
          case 2:
          case 4:
            goto switchD_00124fe2_caseD_2;
          case 3:
            goto switchD_00124fe2_caseD_3;
          case 5:
            greatest_info.test_exclude = argv[iVar3];
            break;
          default:
            goto switchD_00124fe2_default;
          }
          bVar2 = true;
          iVar6 = iVar3;
        }
LAB_00125016:
        if (!bVar2) break;
      }
      iVar6 = iVar6 + 1;
    } while (iVar6 < argc);
  }
  greatest_run_suite(CGTFS_Database,"CGTFS_Database");
  greatest_run_suite(CGTFS_DatabaseStoring,"CGTFS_DatabaseStoring");
  greatest_run_suite(CGTFS_DatabaseFetching,"CGTFS_DatabaseFetching");
  greatest_run_suite(CGTFS_DatabaseUtils,"CGTFS_DatabaseUtils");
  greatest_run_suite(CGTFS_DatabaseAgency,"CGTFS_DatabaseAgency");
  greatest_run_suite(CGTFS_DatabaseCalendarDates,"CGTFS_DatabaseCalendarDates");
  greatest_run_suite(CGTFS_DatabaseCalendarRecords,"CGTFS_DatabaseCalendarRecords");
  greatest_run_suite(CGTFS_DatabaseFareAttributes,"CGTFS_DatabaseFareAttributes");
  greatest_run_suite(CGTFS_DatabaseFareFule,"CGTFS_DatabaseFareFule");
  greatest_run_suite(CGTFS_DatabaseFeedInfo,"CGTFS_DatabaseFeedInfo");
  greatest_run_suite(CGTFS_DatabaseFrequency,"CGTFS_DatabaseFrequency");
  greatest_run_suite(CGTFS_DatabaseLevel,"CGTFS_DatabaseLevel");
  greatest_run_suite(CGTFS_DatabasePathway,"CGTFS_DatabasePathway");
  greatest_run_suite(CGTFS_DatabaseRoute,"CGTFS_DatabaseRoute");
  greatest_run_suite(CGTFS_DatabaseShape,"CGTFS_DatabaseShape");
  greatest_run_suite(CGTFS_DatabaseStopTime,"CGTFS_DatabaseStopTime");
  greatest_run_suite(CGTFS_DatabaseStop,"CGTFS_DatabaseStop");
  greatest_run_suite(CGTFS_DatabaseTransfers,"CGTFS_DatabaseTransfers");
  greatest_run_suite(CGTFS_DatabaseTrip,"CGTFS_DatabaseTrip");
  greatest_run_suite(CGTFS_EnumParsing,"CGTFS_EnumParsing");
  greatest_run_suite(CGTFS_Feed,"CGTFS_Feed");
  greatest_run_suite(CGTFS_Filenames,"CGTFS_Filenames");
  greatest_run_suite(CGTFS_Haversine,"CGTFS_Haversine");
  greatest_run_suite(CGTFS_FileUtils,"CGTFS_FileUtils");
  greatest_run_suite(CGTFS_StrUtils,"CGTFS_StrUtils");
  greatest_run_suite(CGTFS_RecordAgency,"CGTFS_RecordAgency");
  greatest_run_suite(CGTFS_RecordCalendarDate,"CGTFS_RecordCalendarDate");
  greatest_run_suite(CGTFS_RecordCalendarRecord,"CGTFS_RecordCalendarRecord");
  greatest_run_suite(CGTFS_RecordFareAttributes,"CGTFS_RecordFareAttributes");
  greatest_run_suite(CGTFS_RecordFareRule,"CGTFS_RecordFareRule");
  greatest_run_suite(CGTFS_RecordFeedInfo,"CGTFS_RecordFeedInfo");
  greatest_run_suite(CGTFS_RecordFrequency,"CGTFS_RecordFrequency");
  greatest_run_suite(CGTFS_RecordLevel,"CGTFS_RecordLevel");
  greatest_run_suite(CGTFS_RecordPathway,"CGTFS_RecordPathway");
  greatest_run_suite(CGTFS_RecordRoute,"CGTFS_RecordRoute");
  greatest_run_suite(CGTFS_RecordShape,"CGTFS_RecordShape");
  greatest_run_suite(CGTFS_RecordStopTime,"CGTFS_RecordStopTime");
  greatest_run_suite(CGTFS_RecordStop,"CGTFS_RecordStop");
  greatest_run_suite(CGTFS_RecordTransfer,"CGTFS_RecordTransfer");
  greatest_run_suite(CGTFS_RecordTrip,"CGTFS_RecordTrip");
  greatest_run_suite(CGTFS_FileReading,"CGTFS_FileReading");
  GREATEST_PRINT_REPORT();
  return (int)(greatest_info.failed != 0);
}

Assistant:

int main(int argc, char **argv) {
    GREATEST_MAIN_BEGIN();

    RUN_SUITE(CGTFS_Database);
    RUN_SUITE(CGTFS_DatabaseStoring);
    RUN_SUITE(CGTFS_DatabaseFetching);  // Run CGTFS_DatabaseStoring first!
    RUN_SUITE(CGTFS_DatabaseUtils);

    RUN_SUITE(CGTFS_DatabaseAgency);
    RUN_SUITE(CGTFS_DatabaseCalendarDates);
    RUN_SUITE(CGTFS_DatabaseCalendarRecords);
    RUN_SUITE(CGTFS_DatabaseFareAttributes);
    RUN_SUITE(CGTFS_DatabaseFareFule);
    RUN_SUITE(CGTFS_DatabaseFeedInfo);
    RUN_SUITE(CGTFS_DatabaseFrequency);
    RUN_SUITE(CGTFS_DatabaseLevel);
    RUN_SUITE(CGTFS_DatabasePathway);
    RUN_SUITE(CGTFS_DatabaseRoute);
    RUN_SUITE(CGTFS_DatabaseShape);
    RUN_SUITE(CGTFS_DatabaseStopTime);
    RUN_SUITE(CGTFS_DatabaseStop);
    RUN_SUITE(CGTFS_DatabaseTransfers);
    RUN_SUITE(CGTFS_DatabaseTrip);

    RUN_SUITE(CGTFS_EnumParsing);
    RUN_SUITE(CGTFS_Feed);
    RUN_SUITE(CGTFS_Filenames);
    RUN_SUITE(CGTFS_Haversine);

    RUN_SUITE(CGTFS_FileUtils);
    RUN_SUITE(CGTFS_StrUtils);

    RUN_SUITE(CGTFS_RecordAgency);
    RUN_SUITE(CGTFS_RecordCalendarDate);
    RUN_SUITE(CGTFS_RecordCalendarRecord);
    RUN_SUITE(CGTFS_RecordFareAttributes);
    RUN_SUITE(CGTFS_RecordFareRule);
    RUN_SUITE(CGTFS_RecordFeedInfo);
    RUN_SUITE(CGTFS_RecordFrequency);
    RUN_SUITE(CGTFS_RecordLevel);
    RUN_SUITE(CGTFS_RecordPathway);
    RUN_SUITE(CGTFS_RecordRoute);
    RUN_SUITE(CGTFS_RecordShape);
    RUN_SUITE(CGTFS_RecordStopTime);
    RUN_SUITE(CGTFS_RecordStop);
    RUN_SUITE(CGTFS_RecordTransfer);
    RUN_SUITE(CGTFS_RecordTrip);

    RUN_SUITE(CGTFS_FileReading);

    GREATEST_MAIN_END();
}